

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (CScript *__return_storage_ptr__,CScript *inputs,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs_1)

{
  long in_FS_OFFSET;
  int cnt;
  anon_class_16_2_441f04d1 local_48;
  anon_class_16_2_441f04d1 local_38;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  local_24 = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_38.ret = __return_storage_ptr__;
  local_38.cnt = &local_24;
  BuildScript<CScript,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  anon_class_16_2_441f04d1::operator()(&local_38,inputs);
  local_48.ret = __return_storage_ptr__;
  local_48.cnt = &local_24;
  BuildScript<CScript,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  anon_class_16_2_441f04d1::operator()(&local_48,inputs_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}